

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall GenericModel::itemData(GenericModel *this,QModelIndex *index)

{
  bool bVar1;
  GenericModelPrivate *this_00;
  GenericModelItem *pGVar2;
  RolesContainer *pRVar3;
  QVariant *pQVar4;
  QVariant *this_01;
  QModelIndex *in_RDX;
  int local_5c;
  const_iterator local_58 [3];
  int local_3c;
  const_iterator local_38;
  const_iterator displayIter;
  RolesContainer rawData;
  GenericModelPrivate *d;
  QModelIndex *index_local;
  GenericModel *this_local;
  
  bVar1 = QModelIndex::isValid(in_RDX);
  if (bVar1) {
    this_00 = d_func((GenericModel *)index);
    if ((this_00->m_mergeDisplayEdit & 1U) == 0) {
      pGVar2 = GenericModelPrivate::itemForIndex(this_00,in_RDX);
      pRVar3 = convertFromContainer<QMap<int,QVariant>,void>(&pGVar2->data);
      QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this,pRVar3);
    }
    else {
      pGVar2 = GenericModelPrivate::itemForIndex(this_00,in_RDX);
      QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)&displayIter,&pGVar2->data);
      local_3c = 0;
      local_38._M_node =
           (_Base_ptr)QMap<int,_QVariant>::constFind((QMap<int,_QVariant> *)&displayIter,&local_3c);
      local_58[0]._M_node =
           (_Base_ptr)QMap<int,_QVariant>::constEnd((QMap<int,_QVariant> *)&displayIter);
      bVar1 = ::operator!=((const_iterator *)&local_38,(const_iterator *)local_58);
      if (bVar1) {
        pQVar4 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_38);
        local_5c = 2;
        this_01 = QMap<int,_QVariant>::operator[]((QMap<int,_QVariant> *)&displayIter,&local_5c);
        ::QVariant::operator=(this_01,(QVariant *)pQVar4);
      }
      pRVar3 = convertFromContainer<QMap<int,QVariant>,void>((RolesContainer *)&displayIter);
      QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this,pRVar3);
      QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)&displayIter);
    }
  }
  else {
    memset(this,0,8);
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this);
  }
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> GenericModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid())
        return QMap<int, QVariant>();
    Q_ASSERT(index.model() == this);
    Q_D(const GenericModel);
    if (!d->m_mergeDisplayEdit)
        return convertFromContainer<QMap<int, QVariant>>(d->itemForIndex(index)->data);
    RolesContainer rawData = d->itemForIndex(index)->data;
    const auto displayIter = rawData.constFind(Qt::DisplayRole);
    if (displayIter != rawData.constEnd())
        rawData[Qt::EditRole] = displayIter.value();
    return convertFromContainer<QMap<int, QVariant>>(rawData);
}